

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

uint32_t find_rec(char *name)

{
  int iVar1;
  size_t sVar2;
  uint32_t local_24;
  uint8_t *puStack_20;
  uint32_t n;
  char *p;
  char *name_local;
  
  local_24 = 2;
  for (puStack_20 = obuf; *puStack_20 != '\0'; puStack_20 = puStack_20 + sVar2 + 1) {
    iVar1 = strcmp((char *)puStack_20,name);
    if (iVar1 == 0) {
      return local_24;
    }
    sVar2 = strlen((char *)puStack_20);
    local_24 = local_24 + 1;
  }
  sVar2 = strlen(name);
  if (puStack_20 + sVar2 + 1 <= obuf + 0x1fff) {
    strcpy((char *)puStack_20,name);
    return local_24;
  }
  fprintf(_stderr,"Error: output buffer overflow\n");
  exit(1);
}

Assistant:

static uint32_t find_rec(char *name)
{
  char *p = (char *)obuf;
  uint32_t n;
  for (n = 2; *p; n++) {
    if (strcmp(p, name) == 0)
      return n;
    p += strlen(p)+1;
  }
  if (p+strlen(name)+1 >= (char *)obuf+sizeof(obuf)) {
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  strcpy(p, name);
  return n;
}